

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcfs.c
# Opt level: O2

Header * arcfs_read_header(FILE *ifp)

{
  arcfs_header paVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined8 uVar9;
  Halfword HVar10;
  Halfword HVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  Byte BVar14;
  Byte BVar15;
  int iVar16;
  Word WVar17;
  Word WVar18;
  Word WVar19;
  Word WVar20;
  Word WVar21;
  Word WVar22;
  Word WVar23;
  Word WVar24;
  Header *pHVar25;
  Byte BVar26;
  char *fmt;
  uint uVar27;
  long lVar28;
  bool bVar29;
  arcfs_header local_68;
  Byte name [12];
  
  if (arcfs_initialised == '\x01') {
    if (header_ptr != (arcfs_header)0x0) {
      pHVar25 = header_ptr->header;
      if ((header_ptr->is_dir != '\0') ||
         (iVar16 = fseek((FILE *)ifp,(ulong)header_ptr->seek,0), iVar16 == 0)) {
LAB_00103a0c:
        arcfs_maxbits = (uint)header_ptr->maxbits;
        header_ptr = header_ptr->next;
        return pHVar25;
      }
      error("Cannot seek compressed data in this file");
    }
  }
  else {
    arcfs_initialised = '\x01';
    null_header.comptype = '\0';
    null_header.name[0] = '\0';
    null_header.name[1] = '\0';
    null_header.name[2] = '\0';
    null_header.name[3] = '\0';
    null_header.name[4] = '\0';
    null_header.name[5] = '\0';
    null_header.name[6] = '\0';
    null_header.name[7] = '\0';
    null_header.name[8] = '\0';
    null_header.name[9] = '\0';
    null_header.name[10] = '\0';
    null_header.name[0xb] = '\0';
    null_header.name[0xc] = '\0';
    null_header.name[0xd] = '\0';
    null_header._15_1_ = 0;
    null_header.complen = 0;
    null_header.date = 0;
    null_header.time = 0;
    null_header.crc = 0;
    null_header._26_2_ = 0;
    null_header.origlen = 0;
    null_header.load = 0;
    null_header.exec = 0;
    null_header.attr = 0;
    WVar17 = read_word(ifp);
    WVar18 = read_word(ifp);
    WVar19 = read_word(ifp);
    if (WVar19 < 0x29) {
      read_word(ifp);
      WVar19 = read_word(ifp);
      if (WVar19 == 0) {
        iVar16 = 0x11;
        while (bVar29 = iVar16 != 0, iVar16 = iVar16 + -1, bVar29) {
          read_word(ifp);
        }
        local_68 = (arcfs_header)0x0;
        for (uVar27 = 0; uVar27 != WVar17 / 0x24; uVar27 = uVar27 + 1) {
          pHVar25 = (Header *)malloc(0x2c);
          header_ptr = (arcfs_header)malloc(0x20);
          if ((pHVar25 == (Header *)0x0) || (header_ptr == (arcfs_header)0x0)) {
            fmt = "Out of memory";
            goto LAB_00103a29;
          }
          BVar14 = read_byte(ifp);
          for (lVar28 = 0; lVar28 != 0xb; lVar28 = lVar28 + 1) {
            BVar15 = read_byte(ifp);
            if (BVar15 == '/') {
              BVar15 = '_';
            }
            BVar26 = '\0';
            if (0xa0 < (byte)(BVar15 + 0x81)) {
              BVar26 = BVar15;
            }
            name[lVar28] = BVar26;
          }
          name[0xb] = '\0';
          WVar19 = read_word(ifp);
          WVar20 = read_word(ifp);
          WVar21 = read_word(ifp);
          WVar22 = read_word(ifp);
          WVar23 = read_word(ifp);
          WVar24 = read_word(ifp);
          paVar1 = header_ptr;
          if (BVar14 == '\x01') {
            free(pHVar25);
            free(header_ptr);
          }
          else {
            header_ptr->is_dir = (byte)(WVar24 >> 0x1f);
            paVar1->info_byte = BVar14;
            paVar1->info_word = WVar24;
            paVar1->maxbits = (Byte)(WVar22 >> 8);
            paVar1->seek = (WVar24 & 0x7fffffff) + WVar18;
            pHVar25->comptype = BVar14;
            strcpy(pHVar25->name,(char *)name);
            pHVar25->complen = WVar23;
            pHVar25->date = 0;
            pHVar25->time = 0;
            pHVar25->crc = (Halfword)(WVar22 >> 0x10);
            pHVar25->origlen = WVar19;
            pHVar25->load = WVar20;
            pHVar25->exec = WVar21;
            pHVar25->attr = WVar22 & 0xff;
            arcfs_fixtime(pHVar25);
            uVar9 = null_header._36_8_;
            WVar19 = null_header.load;
            paVar1 = header_ptr;
            if (BVar14 == '\0') {
              pHVar25->origlen = null_header.origlen;
              uVar13 = null_header._36_8_;
              pHVar25->load = WVar19;
              null_header.exec = (Word)uVar9;
              null_header.attr = SUB84(uVar9,4);
              WVar20 = null_header.attr;
              pHVar25->exec = null_header.exec;
              null_header._36_8_ = uVar13;
              WVar19 = null_header.origlen;
              uVar12 = null_header._24_4_;
              pHVar25->attr = WVar20;
              HVar10 = null_header.date;
              HVar11 = null_header.time;
              pHVar25->complen = null_header.complen;
              pHVar25->date = HVar10;
              pHVar25->time = HVar11;
              pHVar25->crc = (short)uVar12;
              uVar9 = null_header._8_8_;
              *(short *)&pHVar25->field_0x1a = SUB42(uVar12,2);
              pHVar25->origlen = WVar19;
              cVar2 = null_header.name[0];
              cVar3 = null_header.name[1];
              cVar4 = null_header.name[2];
              cVar5 = null_header.name[3];
              cVar6 = null_header.name[4];
              cVar7 = null_header.name[5];
              cVar8 = null_header.name[6];
              pHVar25->comptype = null_header.comptype;
              pHVar25->name[0] = cVar2;
              pHVar25->name[1] = cVar3;
              pHVar25->name[2] = cVar4;
              pHVar25->name[3] = cVar5;
              pHVar25->name[4] = cVar6;
              pHVar25->name[5] = cVar7;
              pHVar25->name[6] = cVar8;
              *(undefined8 *)(pHVar25->name + 7) = uVar9;
              paVar1->is_dir = '\0';
              paVar1->seek = 0;
            }
            else if (header_ptr->is_dir != '\0') {
              pHVar25->comptype = '\x02';
              pHVar25->load = 0xfffddcff;
            }
            paVar1->header = pHVar25;
            if (local_68 == (arcfs_header)0x0) {
              header_list = paVar1;
              local_68 = paVar1;
            }
            else {
              local_68->next = paVar1;
              local_68 = header_ptr;
            }
          }
        }
        header_ptr = header_list;
        pHVar25 = header_list->header;
        if ((header_list->is_dir != '\0') ||
           (iVar16 = fseek((FILE *)ifp,(ulong)header_list->seek,0), iVar16 == 0)) goto LAB_00103a0c;
        fmt = "Cannot seek compressed data in this file";
LAB_00103a29:
        error(fmt);
      }
      else {
        error("Archive format %d not understood",(ulong)WVar19);
      }
    }
    else {
      error("Archive created by a newer version of ArcFS (%d.%02d)",(ulong)WVar19 / 100,
            (ulong)WVar19 % 100);
    }
  }
  return &null_header;
}

Assistant:

Header *
arcfs_read_header(FILE *ifp)
{
	Word data_start;
	Word header_length = 0;
	Header *header;
	Word version;
	Word i;
	Byte info_byte, name[12];
	Word length, load, exec, attr, complen, info_word;
	arcfs_header header_prev = NULL;
	int j;

	/* Return next header from list */
	if (arcfs_initialised)
	{
		/* If end of list return an empty header structure to indicate EOF */
		if (header_ptr == NULL)
			return (&null_header);

		/* Return next header in list */
		header = header_ptr->header;
		/* Seek to start of compressed data */
		if ((!header_ptr->is_dir)
			&& (fseek(ifp, (long) header_ptr->seek, SEEK_SET)))
		{
			error("Cannot seek compressed data in this file");
			return (&null_header);
		}
		/* Set up number of compression bits */
		arcfs_maxbits = header_ptr->maxbits;
		/*if (header_ptr->is_dir) header = &null_header; */
		header_ptr = header_ptr->next;
		return (header);
	}

	/* Header list not constructed yet, so read all headers from file */
	arcfs_initialised = 1;
	memset((char *) &null_header, '\0', sizeof(null_header));
	null_header.comptype = 0;
	header_length = read_word(ifp);
	data_start = read_word(ifp);
	if ((version = read_word(ifp)) > 40)
	{
		/* BB removed floating point routines from next line
		   This saves linking the floating point routines under DOS
		   which yields quite a reduction in executable size.
		   And it removes the need to have the FPE present under RISC OS. */
		/* error("Archive created by a newer version of ArcFS (%.2f)",((float)version)/100); */
		error("Archive created by a newer version of ArcFS (%d.%02d)",
			   version / 100, version % 100);
		return (&null_header);
	}
	read_word(ifp);				/* read/write version */
	if ((version = read_word(ifp)) > 0)
	{
		error("Archive format %d not understood", version);
		return (&null_header);
	}
	for (i = 0; i < 17; i++)
		read_word(ifp);			/* reserved */

	/* Read list of headers */
	for (i = 0; i < header_length / 36; i++)
	{
		/* Create list item */
		header = (Header *) malloc(sizeof(Header));
		header_ptr = (arcfs_header) malloc(sizeof(struct arcfs_header_s));
		if ((header == NULL) || (header_ptr == NULL))
		{
			error("Out of memory");
			return (&null_header);
		}

		/* Read ArcFS file header */
		info_byte = read_byte(ifp);
		for (j = 0; j < 11; j++)
		{
			name[j] = read_byte(ifp);
			if (name[j] == PATHSEP)
				name[j] = '_';
			if (name[j] < ' ' || name[j] > '~')
				name[j] = '\0';
		}
		name[j] = '\0';
		length = read_word(ifp);
		load = read_word(ifp);
		exec = read_word(ifp);
		attr = read_word(ifp);
		complen = read_word(ifp);
		info_word = read_word(ifp);

		/* Examine, and create nspark header */
		if (info_byte == AFS_DELETED)
		{
			free(header);
			free(header_ptr);
			continue;
		}
		/* BB changed next line for Borland C/C++ 4 */
		/* header_ptr->is_dir = (info_word >> 31); */
#ifdef __MSDOS__
		header_ptr->is_dir = (Halfword) (info_word >> 31);
#else
		header_ptr->is_dir = (info_word >> 31);
#endif
		header_ptr->info_byte = info_byte;
		header_ptr->info_word = info_word;
		/* BB changed next line for Borland C/C++ 4 */
		/* header_ptr->maxbits = (attr & 0xff00) >> 8; */
#ifdef __MSDOS__
		header_ptr->maxbits = (Halfword) (attr & 0xff00) >> 8;
#else
		header_ptr->maxbits = (attr & 0xff00) >> 8;
#endif
		/* BB changed constant in next line to long. */
		header_ptr->seek = (info_word & 0x7fffffffL) + data_start;
		header->comptype = info_byte;
		strcpy(header->name, (char *) name);
		header->complen = complen;
		header->date = 0;
		header->time = 0;
		header->crc = (Halfword) (attr >> 16);
		header->origlen = length;
		header->load = load;
		header->exec = exec;
		header->attr = attr & 0xff;

		arcfs_fixtime(header);

		if (info_byte == AFS_ENDDIR)
		{
			/* Just return comptype == 0 */
			*header = null_header;
			header_ptr->is_dir = 0;
			header_ptr->seek = 0;
		}

		/* If it is an ArcFS directory then convert to a Spark directory */
		if (header_ptr->is_dir)
		{
			/* Make sure filetype is DDC */
			header->comptype = CT_NOTCOMP2;
			/* BB changed constant in next line to long. */
			header->load = 0xfffddcffL;
		}

		/* Add list item to list */
		/* Doing it here ensures that deleted items are not added */
		header_ptr->header = header;
		if (header_prev)
			header_prev->next = header_ptr;
		else
			header_list = header_ptr;
		header_prev = header_ptr;
#ifdef DEBUGGING
		print_header(header);
#endif
	}

	/* Return first element */
	header_ptr = header_list;
	header = header_ptr->header;
	/* Seek to start of data for first element */
	if ((!header_ptr->is_dir)
		&& (fseek(ifp, (long) header_ptr->seek, SEEK_SET)))
	{
		error("Cannot seek compressed data in this file");
		return (&null_header);
	}
	/* Set up number of compression bits */
	arcfs_maxbits = header_ptr->maxbits;
	/*if (header_ptr->is_dir) header = &null_header; */
	header_ptr = header_ptr->next;
	return (header);
}